

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O2

char * PVIP_string_c_str(PVIPString *str)

{
  char *__ptr;
  size_t sVar1;
  size_t __size;
  
  __ptr = str->buf;
  sVar1 = str->len;
  if (str->buflen == sVar1) {
    __size = str->buflen + 1;
    str->buflen = __size;
    __ptr = (char *)realloc(__ptr,__size);
    str->buf = __ptr;
    if (__ptr == (char *)0x0) {
      return (char *)0x0;
    }
    sVar1 = str->len;
  }
  __ptr[sVar1] = '\0';
  return str->buf;
}

Assistant:

const char *PVIP_string_c_str(PVIPString *str) {
    if (str->buflen == str->len) {
        str->buflen++;
        str->buf    = realloc(str->buf, str->buflen);
        if (!str->buf) {
            return NULL;
        }
    }
    str->buf[str->len+1-1] = '\0';
    return str->buf;
}